

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool __thiscall ImGuiTextFilter::Draw(ImGuiTextFilter *this,char *label,float width)

{
  bool bVar1;
  float in_XMM0_Da;
  ImGuiTextFilter *unaff_retaddr;
  void *in_stack_00000008;
  undefined4 in_stack_00000010;
  bool value_changed;
  char *in_stack_00000028;
  char *in_stack_00000030;
  
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    ImGui::SetNextItemWidth(in_XMM0_Da);
  }
  bVar1 = ImGui::InputText(in_stack_00000030,in_stack_00000028,(size_t)this,label._4_4_,
                           (ImGuiInputTextCallback)CONCAT44(width,in_stack_00000010),
                           in_stack_00000008);
  if (bVar1) {
    Build(unaff_retaddr);
  }
  return bVar1;
}

Assistant:

bool ImGuiTextFilter::Draw(const char* label, float width)
{
    if (width != 0.0f)
        ImGui::SetNextItemWidth(width);
    bool value_changed = ImGui::InputText(label, InputBuf, IM_ARRAYSIZE(InputBuf));
    if (value_changed)
        Build();
    return value_changed;
}